

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::StringUtil::Split
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,string *delim)

{
  long lVar1;
  char_type *__s;
  string local_a8 [48];
  string local_78 [32];
  string local_58 [8];
  string item;
  size_t prev;
  size_t pos;
  string *delim_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *results;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__return_storage_ptr__);
  ::std::__cxx11::string::string(local_58);
  while (lVar1 = ::std::__cxx11::string::find((string *)str,(ulong)delim), lVar1 != -1) {
    ::std::__cxx11::string::substr((ulong)local_78,(ulong)str);
    ::std::__cxx11::string::operator=(local_58,local_78);
    ::std::__cxx11::string::~string(local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_58);
    __s = (char_type *)::std::__cxx11::string::c_str();
    ::std::char_traits<char>::length(__s);
  }
  ::std::__cxx11::string::substr((ulong)local_a8,(ulong)str);
  ::std::__cxx11::string::operator=(local_58,local_a8);
  ::std::__cxx11::string::~string(local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_58);
  ::std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> StringUtil::Split(
    const std::string &str, const std::string &delim) {
  std::vector<std::string> results;

  size_t pos = 0, prev = 0;
  std::string item;
  while ((pos = str.find(delim, prev)) != std::string::npos) {
    item = str.substr(prev, pos - prev);
    results.push_back(item);
    prev = pos + std::char_traits<char>::length(delim.c_str());
  }
  item = str.substr(prev);
  results.push_back(item);

  return results;
}